

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O1

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,
               XrSpatialEntityComponentDataBoundingBox2DBD *value,string *prefix,string *type_string
               ,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  byte bVar1;
  XrStructureType XVar2;
  pointer pcVar3;
  PFN_xrStructureTypeToString p_Var4;
  void *value_00;
  XrStructureType __val;
  uint uVar5;
  bool bVar6;
  char *pcVar7;
  XrInstance pXVar8;
  invalid_argument *piVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  uint __len;
  XrGeneratedDispatchTable *gen_dispatch_table_00;
  string next_prefix;
  string type_prefix;
  string boundingbox2d_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  XrGeneratedDispatchTable *local_c0;
  long *local_b8;
  long local_b0;
  long local_a8 [2];
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  *local_98;
  undefined1 local_90 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  string local_70;
  string local_50;
  
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  local_e0._M_dataplus._M_p = (pointer)value;
  local_c0 = gen_dispatch_table;
  std::__cxx11::string::_M_construct((ulong)&local_128,'\x12');
  *local_128._M_dataplus._M_p = '0';
  local_128._M_dataplus._M_p[1] = 'x';
  pcVar7 = local_128._M_dataplus._M_p + (local_128._M_string_length - 1);
  lVar11 = 0;
  do {
    bVar1 = *(byte *)((long)&local_e0._M_dataplus._M_p + lVar11);
    *pcVar7 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar1 & 0xf];
    pcVar7[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar1 >> 4];
    lVar11 = lVar11 + 1;
    pcVar7 = pcVar7 + -2;
  } while (lVar11 != 8);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,&local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)prefix);
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  pcVar3 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,pcVar3,pcVar3 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_e0);
  if (local_c0 == (XrGeneratedDispatchTable *)0x0) {
    XVar2 = value->type;
    __val = -XVar2;
    if (0 < (int)XVar2) {
      __val = XVar2;
    }
    __len = 1;
    if (XR_TYPE_SWAPCHAIN_CREATE_INFO < __val) {
      uVar12 = (ulong)__val;
      uVar5 = 4;
      do {
        __len = uVar5;
        uVar10 = (uint)uVar12;
        if (uVar10 < 100) {
          __len = __len - 2;
          goto LAB_001f46db;
        }
        if (uVar10 < 1000) {
          __len = __len - 1;
          goto LAB_001f46db;
        }
        if (uVar10 < 10000) goto LAB_001f46db;
        uVar12 = uVar12 / 10000;
        uVar5 = __len + 4;
      } while (99999 < uVar10);
      __len = __len + 1;
    }
LAB_001f46db:
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    local_98 = (vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents;
    std::__cxx11::string::_M_construct((ulong)&local_128,(char)__len - (char)((int)XVar2 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_128._M_dataplus._M_p + (XVar2 >> 0x1f),__len,__val);
    contents = (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_98;
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              (local_98,(char (*) [16])"XrStructureType",&local_e0,&local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_f8 = 0;
    uStack_f0 = 0;
    local_108 = 0;
    uStack_100 = 0;
    local_128.field_2._M_allocated_capacity = 0;
    local_128.field_2._8_8_ = 0;
    local_128._M_dataplus._M_p = (pointer)0x0;
    local_128._M_string_length = 0;
    p_Var4 = local_c0->StructureTypeToString;
    pXVar8 = FindInstanceFromDispatchTable(local_c0);
    (*p_Var4)(pXVar8,value->type,(char *)&local_128);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&local_e0,(char (*) [64])&local_128);
  }
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  pcVar3 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_128,pcVar3,pcVar3 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_128);
  value_00 = value->next;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,local_128._M_dataplus._M_p,
             local_128._M_dataplus._M_p + local_128._M_string_length);
  bVar6 = ApiDumpDecodeNextChain(local_c0,value_00,&local_50,contents);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (!bVar6) {
    piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar9,"Invalid Operation");
    __cxa_throw(piVar9,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pcVar3 = (prefix->_M_dataplus)._M_p;
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar3,pcVar3 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_b8);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_b8,local_b0 + (long)local_b8);
  gen_dispatch_table_00 = (XrGeneratedDispatchTable *)local_90;
  local_90._0_8_ = local_90 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)gen_dispatch_table_00,"XrRect2Df","");
  bVar6 = ApiDumpOutputXrStruct
                    (gen_dispatch_table_00,&value->boundingBox2D,&local_70,(string *)local_90,false,
                     contents);
  if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
    operator_delete((void *)local_90._0_8_,(ulong)(local_80._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (bVar6) {
    if (local_b8 != local_a8) {
      operator_delete(local_b8,local_a8[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    return true;
  }
  piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar9,"Invalid Operation");
  __cxa_throw(piVar9,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrSpatialEntityComponentDataBoundingBox2DBD* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string boundingbox2d_prefix = prefix;
        boundingbox2d_prefix += "boundingBox2D";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->boundingBox2D, boundingbox2d_prefix, "XrRect2Df", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        return true;
    } catch(...) {
    }
    return false;
}